

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5c813::logical_combination<((anonymous_namespace)::logical_combination_types)0>::
validate(logical_combination<((anonymous_namespace)::logical_combination_types)0> *this,
        json_pointer *ptr,json *instance,json_patch *patch,error_handler *e)

{
  logical_combination_error_handler *plVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  value_t vVar4;
  array_t *paVar5;
  element_type *peVar6;
  char cVar7;
  pointer psVar8;
  vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *this_00;
  long *plVar9;
  undefined8 *puVar10;
  long *plVar11;
  size_type *psVar12;
  ulong uVar13;
  undefined8 *puVar14;
  pointer *ppeVar15;
  char cVar16;
  undefined8 uVar17;
  logical_combination_error_handler *plVar18;
  size_t __new_size;
  ulong uVar19;
  bool bVar20;
  logical_combination_error_handler esub;
  string __str;
  logical_combination_error_handler error_summary;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  logical_combination_error_handler **local_b8;
  logical_combination_error_handler *local_b0;
  logical_combination_error_handler *plStack_a8;
  long local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string *local_78;
  long local_70;
  logical_combination<((anonymous_namespace)::logical_combination_types)0> *local_68;
  json_pointer *local_60;
  json *local_58;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&PTR__logical_combination_error_handler_00164888;
  local_50._M_string_length = 0;
  local_50.field_2._M_allocated_capacity = 0;
  local_50.field_2._8_8_ = 0;
  psVar8 = (this->subschemata_).
           super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_78 = (string *)e;
  local_68 = this;
  local_60 = ptr;
  local_58 = instance;
  if ((this->subschemata_).
      super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar8) {
    local_70 = 0;
    uVar19 = 0;
    do {
      local_b8 = (logical_combination_error_handler **)
                 &PTR__logical_combination_error_handler_00164888;
      local_b0 = (logical_combination_error_handler *)0x0;
      plStack_a8 = (logical_combination_error_handler *)0x0;
      local_a0 = 0;
      vVar4 = (patch->j_).m_type;
      __new_size = (size_t)vVar4;
      if (vVar4 != null) {
        if (vVar4 == object) {
          __new_size = (((patch->j_).m_value.object)->_M_t)._M_impl.super__Rb_tree_header.
                       _M_node_count;
        }
        else if (vVar4 == array) {
          paVar5 = (patch->j_).m_value.array;
          __new_size = (long)(paVar5->
                             super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(paVar5->
                             super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 4;
        }
        else {
          __new_size = 1;
        }
      }
      paVar2 = &local_d8.field_2;
      peVar6 = psVar8[uVar19].
               super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*peVar6->_vptr_schema[3])(peVar6,local_60,local_58,patch,&local_b8);
      if (local_b0 == plStack_a8) {
        local_70 = local_70 + 1;
        local_b8 = (logical_combination_error_handler **)
                   &PTR__logical_combination_error_handler_00164888;
        bVar20 = true;
      }
      else {
        this_00 = nlohmann::json_abi_v3_11_2::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::
                  get_ref_impl<std::vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>&,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                            (&patch->j_);
        std::
        vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::resize(this_00,__new_size);
        cVar16 = '\x01';
        if (9 < uVar19) {
          uVar13 = uVar19;
          cVar7 = '\x04';
          do {
            cVar16 = cVar7;
            if (uVar13 < 100) {
              cVar16 = cVar16 + -2;
              goto LAB_001290bc;
            }
            if (uVar13 < 1000) {
              cVar16 = cVar16 + -1;
              goto LAB_001290bc;
            }
            if (uVar13 < 10000) goto LAB_001290bc;
            bVar20 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar7 = cVar16 + '\x04';
          } while (bVar20);
          cVar16 = cVar16 + '\x01';
        }
LAB_001290bc:
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_98,cVar16);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_98._M_dataplus._M_p,(uint)local_98._M_string_length,uVar19);
        plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x14c41f);
        plVar11 = plVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar11) {
          local_d8.field_2._M_allocated_capacity = *plVar11;
          local_d8.field_2._8_8_ = plVar9[3];
          local_d8._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_d8.field_2._M_allocated_capacity = *plVar11;
          local_d8._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_d8._M_string_length = plVar9[1];
        *plVar9 = (long)plVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_d8);
        psVar12 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_f8.field_2._M_allocated_capacity = *psVar12;
          local_f8.field_2._8_8_ = plVar9[3];
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        }
        else {
          local_f8.field_2._M_allocated_capacity = *psVar12;
          local_f8._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_f8._M_string_length = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        logical_combination_error_handler::propagate
                  (local_b0,&plStack_a8->super_error_handler,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar2) {
          operator_delete(local_d8._M_dataplus._M_p,
                          (ulong)(local_d8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        plVar1 = local_b0;
        if (local_b0 != plStack_a8) {
          std::operator+(&local_f8,
                         "at least one subschema has failed, but all of them are required to validate - "
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_b0[1].error_entry_list_);
          (**(_func_int **)((long)(local_78->_M_dataplus)._M_p + 0x10))
                    (local_78,plVar1,
                     &(plVar1->error_entry_list_).
                      super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          cVar16 = '\x01';
          if (9 < uVar19) {
            uVar13 = uVar19;
            cVar7 = '\x04';
            do {
              cVar16 = cVar7;
              if (uVar13 < 100) {
                cVar16 = cVar16 + -2;
                goto LAB_001292a9;
              }
              if (uVar13 < 1000) {
                cVar16 = cVar16 + -1;
                goto LAB_001292a9;
              }
              if (uVar13 < 10000) goto LAB_001292a9;
              bVar20 = 99999 < uVar13;
              uVar13 = uVar13 / 10000;
              cVar7 = cVar16 + '\x04';
            } while (bVar20);
            cVar16 = cVar16 + '\x01';
          }
LAB_001292a9:
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_98,cVar16);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_98._M_dataplus._M_p,(uint)local_98._M_string_length,uVar19);
          plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x14c409);
          plVar11 = plVar9 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar11) {
            local_d8.field_2._M_allocated_capacity = *plVar11;
            local_d8.field_2._8_8_ = plVar9[3];
            local_d8._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_d8.field_2._M_allocated_capacity = *plVar11;
            local_d8._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_d8._M_string_length = plVar9[1];
          *plVar9 = (long)plVar11;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_d8);
          psVar12 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_f8.field_2._M_allocated_capacity = *psVar12;
            local_f8.field_2._8_8_ = plVar9[3];
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          }
          else {
            local_f8.field_2._M_allocated_capacity = *psVar12;
            local_f8._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_f8._M_string_length = plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          logical_combination_error_handler::propagate
                    (local_b0,&plStack_a8->super_error_handler,local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != paVar2) {
            operator_delete(local_d8._M_dataplus._M_p,
                            (ulong)(local_d8.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
        }
        plVar1 = plStack_a8;
        local_b8 = (logical_combination_error_handler **)
                   &PTR__logical_combination_error_handler_00164888;
        bVar20 = local_b0 == plStack_a8;
        if (bVar20) {
          bVar20 = true;
        }
        else {
          ppeVar15 = &local_b0[1].error_entry_list_.
                      super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
          do {
            if ((pointer)ppeVar15 != ((_Vector_impl_data *)(ppeVar15 + -2))->_M_start) {
              operator_delete(((_Vector_impl_data *)(ppeVar15 + -2))->_M_start,
                              (ulong)((long)&((*ppeVar15)->ptr_).reference_tokens.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + 1));
            }
            nlohmann::json_abi_v3_11_2::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)(ppeVar15 + -4));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(ppeVar15 + -7));
            plVar9 = (long *)(ppeVar15 + 2);
            ppeVar15 = ppeVar15 + 9;
          } while ((logical_combination_error_handler *)plVar9 != plVar1);
        }
      }
      if (local_b0 != (logical_combination_error_handler *)0x0) {
        operator_delete(local_b0,local_a0 - (long)local_b0);
      }
      if (!bVar20) goto LAB_0012977e;
      uVar19 = uVar19 + 1;
      psVar8 = (local_68->subschemata_).
               super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar19 < (ulong)((long)(local_68->subschemata_).
                                    super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar8 >> 4))
    ;
    if ((bool)(bVar20 ^ 1U | local_70 != 0)) goto LAB_0012977e;
  }
  std::operator+(&local_98,
                 "no subschema has succeeded, but one of them is required to validate. Type: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::
                  logical_combination<((anonymous_namespace)::logical_combination_types)0>::
                  key_abi_cxx11_);
  puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_98);
  paVar2 = &local_d8.field_2;
  puVar14 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar14) {
    local_d8.field_2._M_allocated_capacity = *puVar14;
    local_d8.field_2._8_8_ = puVar10[3];
    local_d8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_d8.field_2._M_allocated_capacity = *puVar14;
    local_d8._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_d8._M_string_length = puVar10[1];
  *puVar10 = puVar14;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  uVar19 = (long)(local_68->subschemata_).
                 super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(local_68->subschemata_).
                 super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4;
  cVar16 = '\x01';
  if (9 < uVar19) {
    uVar13 = uVar19;
    cVar7 = '\x04';
    do {
      cVar16 = cVar7;
      if (uVar13 < 100) {
        cVar16 = cVar16 + -2;
        goto LAB_0012957a;
      }
      if (uVar13 < 1000) {
        cVar16 = cVar16 + -1;
        goto LAB_0012957a;
      }
      if (uVar13 < 10000) goto LAB_0012957a;
      bVar20 = 99999 < uVar13;
      uVar13 = uVar13 / 10000;
      cVar7 = cVar16 + '\x04';
    } while (bVar20);
    cVar16 = cVar16 + '\x01';
  }
LAB_0012957a:
  local_b8 = &plStack_a8;
  std::__cxx11::string::_M_construct((ulong)&local_b8,cVar16);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_b8,(uint)local_b0,uVar19);
  plVar1 = (logical_combination_error_handler *)
           ((long)&(local_b0->super_error_handler)._vptr_error_handler + local_d8._M_string_length);
  uVar17 = (logical_combination_error_handler *)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    uVar17 = local_d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar17 < plVar1) {
    plVar18 = (logical_combination_error_handler *)0xf;
    if (local_b8 != &plStack_a8) {
      plVar18 = plStack_a8;
    }
    if (plVar18 < plVar1) goto LAB_001295e2;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_b8,0,(char *)0x0,(ulong)local_d8._M_dataplus._M_p);
  }
  else {
LAB_001295e2:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_b8);
  }
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  psVar12 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_f8.field_2._M_allocated_capacity = *psVar12;
    local_f8.field_2._8_8_ = puVar10[3];
  }
  else {
    local_f8.field_2._M_allocated_capacity = *psVar12;
    local_f8._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_f8._M_string_length = puVar10[1];
  *puVar10 = psVar12;
  puVar10[1] = 0;
  *(undefined1 *)psVar12 = 0;
  (**(_func_int **)((long)(local_78->_M_dataplus)._M_p + 0x10))
            (local_78,local_60,local_58,&local_f8);
  paVar3 = &local_f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar3) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != &plStack_a8) {
    operator_delete(local_b8,(ulong)((long)&(plStack_a8->super_error_handler)._vptr_error_handler +
                                    1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,(ulong)(local_d8.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_d8,"[combination: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::
                  logical_combination<((anonymous_namespace)::logical_combination_types)0>::
                  key_abi_cxx11_);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_d8);
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_f8.field_2._M_allocated_capacity = *psVar12;
    local_f8.field_2._8_8_ = plVar9[3];
    local_f8._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_f8.field_2._M_allocated_capacity = *psVar12;
    local_f8._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_f8._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  logical_combination_error_handler::propagate
            ((logical_combination_error_handler *)local_50._M_string_length,
             (error_handler *)local_50.field_2._M_allocated_capacity,local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar3) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,(ulong)(local_d8.field_2._M_allocated_capacity + 1));
  }
LAB_0012977e:
  uVar17 = local_50.field_2._M_allocated_capacity;
  local_50._M_dataplus._M_p = (pointer)&PTR__logical_combination_error_handler_00164888;
  if (local_50._M_string_length != local_50.field_2._M_allocated_capacity) {
    ppeVar15 = &(((logical_combination_error_handler *)(local_50._M_string_length + 0x20))->
                error_entry_list_).
                super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      if ((pointer)ppeVar15 != ((_Vector_impl_data *)(ppeVar15 + -2))->_M_start) {
        operator_delete(((_Vector_impl_data *)(ppeVar15 + -2))->_M_start,
                        (ulong)((long)&((*ppeVar15)->ptr_).reference_tokens.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 1));
      }
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)(ppeVar15 + -4));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(ppeVar15 + -7));
      plVar9 = (long *)(ppeVar15 + 2);
      ppeVar15 = ppeVar15 + 9;
    } while (plVar9 != (long *)uVar17);
  }
  if ((logical_combination_error_handler *)local_50._M_string_length !=
      (logical_combination_error_handler *)0x0) {
    operator_delete((void *)local_50._M_string_length,
                    local_50.field_2._8_8_ - local_50._M_string_length);
  }
  return;
}

Assistant:

void validate(const json::json_pointer &ptr, const json &instance, json_patch &patch, error_handler &e) const final
	{
		size_t count = 0;
		logical_combination_error_handler error_summary;

		for (std::size_t index = 0; index < subschemata_.size(); ++index) {
			const std::shared_ptr<schema> &s = subschemata_[index];
			logical_combination_error_handler esub;
			auto oldPatchSize = patch.get_json().size();
			s->validate(ptr, instance, patch, esub);
			if (!esub)
				count++;
			else {
				patch.get_json().get_ref<nlohmann::json::array_t &>().resize(oldPatchSize);
				esub.propagate(error_summary, "case#" + std::to_string(index) + "] ");
			}

			if (is_validate_complete(instance, ptr, e, esub, count, index))
				return;
		}

		if (count == 0) {
			e.error(ptr, instance, "no subschema has succeeded, but one of them is required to validate. Type: " + key + ", number of failed subschemas: " + std::to_string(subschemata_.size()));
			error_summary.propagate(e, "[combination: " + key + " / ");
		}
	}